

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
xemmai::t_time::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_time *this)

{
  t_define<xemmai::t_time> *ptVar1;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_tuple_&,_long,_long),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_161;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_160;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_string_&),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_149;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_148;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_tuple_&),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_131;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_130;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_string_&),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_119;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_118;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_tuple_&,_long),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_101;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_100;
  t_static<xemmai::t_object_*(*)(const_xemmai::t_string_&),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_e9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_e8;
  t_static<long_(*)(),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke> local_d1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_d0;
  t_static<xemmai::t_object_*(*)(double),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_b9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_b8;
  t_static<double_(*)(const_xemmai::t_tuple_&),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_a1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_a0;
  t_static<long_(*)(xemmai::t_time_*),_&xemmai::t_time::f_define()::(anonymous_class)::__invoke>
  local_89;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_88;
  t_static<double_(*)(),_&xemmai::(anonymous_namespace)::f_now> local_61;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_60;
  t_define<xemmai::t_time> local_50;
  t_time *local_18;
  t_time *this_local;
  
  local_18 = this;
  this_local = (t_time *)__return_storage_ptr__;
  t_define<xemmai::t_time>::t_define(&local_50,this);
  local_60 = sv(L"now",3);
  ptVar1 = t_define<xemmai::t_time>::operator()(&local_50,local_60,&local_61);
  local_88 = sv(L"tick",4);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_88,&local_89);
  local_a0 = sv(L"compose",7);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_a0,&local_a1);
  local_b8 = sv(L"decompose",9);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_b8,&local_b9);
  local_d0 = sv(L"offset",6);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_d0,&local_d1);
  local_e8 = sv(L"parse_rfc2822",0xd);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_e8,&local_e9);
  local_100 = sv(L"format_rfc2822",0xe);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_100,&local_101);
  local_118 = sv(L"parse_http",10);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_118,&local_119);
  local_130 = sv(L"format_http",0xb);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_130,&local_131);
  local_148 = sv(L"parse_xsd",9);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_148,&local_149);
  local_160 = sv(L"format_xsd",10);
  ptVar1 = t_define<xemmai::t_time>::operator()(ptVar1,local_160,&local_161);
  t_define::operator_cast_to_vector(__return_storage_ptr__,(t_define *)ptVar1);
  t_define<xemmai::t_time>::~t_define(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_time::f_define()
{
	return t_define(this)
	(L"now"sv, t_static<double(*)(), f_now>())
	(L"tick"sv, t_static<intptr_t(*)(t_time*), [](t_time* a_library) -> intptr_t
	{
#ifdef __unix__
		return (f_now() - a_library->v_tick_base) * 1000.0;
#endif
#ifdef _WIN32
		return GetTickCount();
#endif
	}>())
	(L"compose"sv, t_static<double(*)(const t_tuple&), [](const t_tuple& a_value)
	{
		size_t n = a_value.f_size();
		if (n < 3) f_throw(L"must have at least 3 items."sv);
		intptr_t year = f_item(a_value, 0);
		intptr_t month = f_item(a_value, 1) - 1;
		year += month / 12;
		month %= 12;
		if (month < 0) {
			--year;
			month += 12;
		}
		intptr_t days = v_month_base_days[month];
		if ((month > 1) && year % 4 == 0 && (year % 100 != 0 || year % 400 == 0)) ++days;
		--year;
		days += year * 365 + year / 4 - year / 100 + year / 400;
		double t = days + f_item(a_value, 2) - 1 - v_epoch_days;
		t *= 24.0;
		if (n >= 4) t += f_item(a_value, 3);
		t *= 60.0;
		if (n >= 5) t += f_item(a_value, 4);
		t *= 60.0;
		if (n >= 6) t += f_item_with_fraction(a_value, 5);
		return t;
	}>())
	(L"decompose"sv, t_static<t_object*(*)(double), [](double a_value)
	{
		auto t0 = static_cast<std::time_t>(std::floor(a_value));
		double fraction = a_value - t0;
		std::tm* t1 = std::gmtime(&t0);
		return f_tuple(t1->tm_year + 1900, t1->tm_mon + 1, t1->tm_mday, t1->tm_hour, t1->tm_min, t1->tm_sec + fraction, t1->tm_wday, t1->tm_yday + 1);
	}>())
	(L"offset"sv, t_static<intptr_t(*)(), []() -> intptr_t
	{
		tzset();
#ifdef __unix__
		return -timezone;
#endif
#ifdef _WIN32
		return -_timezone;
#endif
	}>())
	(L"parse_rfc2822"sv, t_static<t_object*(*)(const t_string&), [](const t_string& a_value)
	{
		const wchar_t* s = a_value;
		intptr_t day;
		wchar_t month[4];
		intptr_t year;
		intptr_t hour;
		intptr_t minute;
		int i;
		int n = std::swscanf(s, XEMMAI__MACRO__L("%*3ls, %2" SCNdPTR " %3ls %4" SCNdPTR " %2" SCNdPTR ":%2" SCNdPTR "%n"), &day, month, &year, &hour, &minute, &i);
		if (n < 5) f_throw(L"invalid format."sv);
		intptr_t m = f_month_name_to_number(month);
		if (m <= 0) f_throw(L"invalid format."sv);
		intptr_t second;
		wchar_t zone[6];
		if (s[i] == L':') {
			n = std::swscanf(s + ++i, XEMMAI__MACRO__L("%2" SCNdPTR " %5ls"), &second, zone);
			if (n < 2) f_throw(L"invalid format."sv);
		} else {
			second = 0;
			n = std::swscanf(s + i, L" %5ls", zone);
			if (n < 1) f_throw(L"invalid format."sv);
		}
		if (year < 50)
			year += 2000;
		else if (year < 1000)
			year += 1900;
		return f_tuple(year, m, day, hour, minute, second, f_zone_to_offset(zone));
	}>())
	(L"format_rfc2822"sv, t_static<t_object*(*)(const t_tuple&, intptr_t), [](const t_tuple& a_value, intptr_t a_offset)
	{
		size_t n = a_value.f_size();
		if (n < 7) f_throw(L"must have at least 7 items."sv);
		intptr_t year = f_item(a_value, 0);
		intptr_t month = f_item(a_value, 1);
		intptr_t day = f_item(a_value, 2);
		intptr_t hour = f_item(a_value, 3);
		intptr_t minute = f_item(a_value, 4);
		intptr_t second = static_cast<intptr_t>(std::floor(f_item_with_fraction(a_value, 5)));
		intptr_t week = f_item(a_value, 6);
		wchar_t sign = (a_offset > 0) ? L'+' : L'-';
		a_offset = std::abs(a_offset) / 60;
		wchar_t cs[32];
		n = std::swprintf(cs, sizeof(cs) / sizeof(wchar_t), XEMMAI__MACRO__L("%ls, %" PRIdPTR " %ls %04" PRIdPTR " %02" PRIdPTR ":%02" PRIdPTR ":%02" PRIdPTR " %lc%02" PRIdPTR "%02" PRIdPTR), v_rfc2822_days[week], day, v_rfc2822_months[month - 1], year, hour, minute, second, sign, a_offset / 60, a_offset % 60);
		return t_string::f_instantiate(cs, n);
	}>())
	(L"parse_http"sv, t_static<t_object*(*)(const t_string&), [](const t_string& a_value)
	{
		intptr_t day;
		wchar_t month[4];
		intptr_t year;
		intptr_t hour;
		intptr_t minute;
		intptr_t second;
		int n = std::swscanf(a_value, XEMMAI__MACRO__L("%*3ls, %2" SCNdPTR " %3ls %4" SCNdPTR " %2" SCNdPTR ":%2" SCNdPTR ":%2" SCNdPTR " GMT"), &day, month, &year, &hour, &minute, &second);
		if (n < 6) {
			n = std::swscanf(a_value, XEMMAI__MACRO__L("%*l[A-Za-z], %2" SCNdPTR "-%3ls-%2" SCNdPTR " %2" SCNdPTR ":%2" SCNdPTR ":%2" SCNdPTR " GMT"), &day, month, &year, &hour, &minute, &second);
			if (n < 6) {
				n = std::swscanf(a_value, XEMMAI__MACRO__L("%*3ls %3ls %2" SCNdPTR " %2" SCNdPTR ":%2" SCNdPTR ":%2" SCNdPTR " %4" SCNdPTR), month, &day, &hour, &minute, &second, &year);
				if (n < 6) f_throw(L"invalid format."sv);
			}
		}
		intptr_t m = f_month_name_to_number(month);
		if (m <= 0) f_throw(L"invalid format."sv);
		if (year < 50)
			year += 2000;
		else if (year < 1000)
			year += 1900;
		return f_tuple(year, m, day, hour, minute, second);
	}>())
	(L"format_http"sv, t_static<t_object*(*)(const t_tuple&), [](const t_tuple& a_value)
	{
		if (a_value.f_size() < 7) f_throw(L"must have at least 7 items."sv);
		intptr_t year = f_item(a_value, 0);
		intptr_t month = f_item(a_value, 1);
		intptr_t day = f_item(a_value, 2);
		intptr_t hour = f_item(a_value, 3);
		intptr_t minute = f_item(a_value, 4);
		intptr_t second = static_cast<intptr_t>(std::floor(f_item_with_fraction(a_value, 5)));
		intptr_t week = f_item(a_value, 6);
		wchar_t cs[30];
		size_t n = std::swprintf(cs, sizeof(cs) / sizeof(wchar_t), XEMMAI__MACRO__L("%ls, %02" PRIdPTR " %ls %04" PRIdPTR " %02" PRIdPTR ":%02" PRIdPTR ":%02" PRIdPTR " GMT"), v_rfc2822_days[week], day, v_rfc2822_months[month - 1], year, hour, minute, second);
		return t_string::f_instantiate(cs, n);
	}>())
	(L"parse_xsd"sv, t_static<t_object*(*)(const t_string&), [](const t_string& a_value)
	{
		intptr_t year;
		intptr_t month;
		intptr_t day;
		intptr_t hour;
		intptr_t minute;
		double second;
		wchar_t zone[7];
		int n = std::swscanf(a_value, XEMMAI__MACRO__L("%5" SCNdPTR "-%2" SCNdPTR "-%2" SCNdPTR "T%2" SCNdPTR ":%2" SCNdPTR ":%lf%6ls"), &year, &month, &day, &hour, &minute, &second, zone);
		if (n < 6) f_throw(L"invalid format."sv);
		return n < 7 ? f_tuple(year, month, day, hour, minute, second) : f_tuple(year, month, day, hour, minute, second, f_zone_to_offset(zone));
	}>())
	(L"format_xsd"sv, t_static<t_object*(*)(const t_tuple&, intptr_t, intptr_t), [](const t_tuple& a_value, intptr_t a_offset, intptr_t a_precision)
	{
		if (a_value.f_size() < 6) f_throw(L"must have at least 6 items."sv);
		intptr_t year = f_item(a_value, 0);
		intptr_t month = f_item(a_value, 1);
		intptr_t day = f_item(a_value, 2);
		intptr_t hour = f_item(a_value, 3);
		intptr_t minute = f_item(a_value, 4);
		double second = f_item_with_fraction(a_value, 5);
		wchar_t cs[30];
		size_t n;
		if (a_offset == 0) {
			n = std::swprintf(cs, sizeof(cs) / sizeof(wchar_t), XEMMAI__MACRO__L("%04" PRIdPTR "-%02" PRIdPTR "-%02" PRIdPTR "T%02" PRIdPTR ":%02" PRIdPTR ":%02.*fZ"), year, month, day, hour, minute, a_precision, second);
		} else {
			wchar_t sign = (a_offset > 0) ? L'+' : L'-';
			a_offset = std::abs(a_offset) / 60;
			n = std::swprintf(cs, sizeof(cs) / sizeof(wchar_t), XEMMAI__MACRO__L("%04" PRIdPTR "-%02" PRIdPTR "-%02" PRIdPTR "T%02" PRIdPTR ":%02" PRIdPTR ":%02.*f%lc%02" PRIdPTR ":%02" PRIdPTR), year, month, day, hour, minute, a_precision, second, sign, a_offset / 60, a_offset % 60);
		}
		return t_string::f_instantiate(cs, n);
	}>())
	;
}